

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::
list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::push_front(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,value_type *val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar3
  ;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *plVar4
  ;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  this_00 = (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x30);
  paVar1 = &local_58.data.field_2;
  pcVar2 = (val->_M_dataplus)._M_p;
  local_58.data._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + val->_M_string_length);
  local_58.prev =
       (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )0x0;
  local_58.next =
       (listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )0x0;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  listNode(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.data._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.data._M_dataplus._M_p,local_58.data.field_2._M_allocated_capacity + 1);
  }
  plVar3 = this->m_head;
  plVar4 = plVar3->next;
  this_00->next = plVar4;
  plVar4->prev = this_00;
  this_00->prev = plVar3;
  plVar3->next = this_00;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_front(value_type const & val) {
		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);
		newNode->next = this->head()->next;
		newNode->next->prev = newNode;
		newNode->prev = this->head();
		this->head()->next = newNode;
		++this->m_size;
	}